

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpPackedVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  uint32_t uVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  LogMessage *pLVar6;
  undefined1 auVar7 [16];
  LogMessageFatal local_b0 [23];
  Voidify local_99;
  int local_98;
  unsigned_short local_92;
  string *local_90;
  string *absl_log_internal_check_op_result;
  ushort local_7c;
  ushort local_7a;
  uint16_t rep;
  MessageLite *pMStack_78;
  uint16_t xform_val;
  uint local_70;
  ushort local_6a;
  uint32_t decoded_wiretype;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint32_t has_bits_offset;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar2 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  _decoded_wiretype =
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar2);
  local_6a = _decoded_wiretype->type_card;
  uVar2 = TcFieldData::tag((TcFieldData *)&msg_local);
  local_70 = uVar2 & 7;
  if (local_70 != 2) {
    pMStack_78 = msg_local;
    pcVar4 = MpRepeatedVarint<false>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar4;
  }
  local_7a = local_6a & 0x600;
  if (*(ushort *)hasbits_local != 0) {
    uVar3 = (uint)entry;
    puVar5 = RefAt<unsigned_int>(ptr_local,(ulong)(uint)*(ushort *)hasbits_local);
    *puVar5 = uVar3 | *puVar5;
  }
  local_7c = local_6a & 0x1c0;
  uVar1 = local_7c >> 6;
  if (uVar1 == 0) {
    pcVar4 = MpPackedVarintT<false,bool,(unsigned_short)0>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar4;
  }
  if (uVar1 == 2) {
    switch(local_7a >> 9) {
    case 0:
      pcVar4 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar4;
    case 1:
      pcVar4 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar4;
    case 2:
      pcVar4 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar4;
    case 3:
      pcVar4 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar4;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x836);
    }
  }
  if (uVar1 != 3) {
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x83d);
  }
  if (local_7a == 0) {
    absl_log_internal_check_op_result = (string *)msg_local;
    pcVar4 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar4;
  }
  local_92 = absl::lts_20240722::log_internal::GetReferenceableValue(local_7a);
  local_98 = absl::lts_20240722::log_internal::GetReferenceableValue(0x200);
  local_90 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,int>
                       (&local_92,&local_98,"xform_val == +field_layout::kTvZigZag");
  if (local_90 == (string *)0x0) {
    pcVar4 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar4;
  }
  auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0x81f,auVar7._0_8_,auVar7._8_8_);
  pLVar6 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_b0);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_99,pLVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpPackedVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const auto type_card = entry.type_card;
  const auto decoded_wiretype = data.tag() & 7;

  // Check for non-packed repeated fallback:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  // For split we avoid the duplicate code and have the impl reload the value.
  // Less code bloat for uncommon paths.
  const uint16_t xform_val = (type_card & field_layout::kTvMask);

  // Since ctx->ReadPackedFixed does not use TailCall<> or Return<>, sync any
  // pending hasbits now:
  SyncHasbits(msg, hasbits, table);

  const uint16_t rep = type_card & field_layout::kRepMask;

  switch (rep >> field_layout::kRepShift) {
    case field_layout::kRep64Bits >> field_layout::kRepShift:
      if (xform_val == 0) {
        PROTOBUF_MUSTTAIL return MpPackedVarintT<is_split, uint64_t, 0>(
            PROTOBUF_TC_PARAM_PASS);
      } else {
        ABSL_DCHECK_EQ(xform_val, +field_layout::kTvZigZag);
        PROTOBUF_MUSTTAIL return MpPackedVarintT<
            is_split, uint64_t, (is_split ? 0 : field_layout::kTvZigZag)>(
            PROTOBUF_TC_PARAM_PASS);
      }
    case field_layout::kRep32Bits >> field_layout::kRepShift:
      switch (xform_val >> field_layout::kTvShift) {
        case 0:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<is_split, uint32_t, 0>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvZigZag >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvZigZag)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvEnum >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvEnum)>(
              PROTOBUF_TC_PARAM_PASS);
        case field_layout::kTvRange >> field_layout::kTvShift:
          PROTOBUF_MUSTTAIL return MpPackedVarintT<
              is_split, uint32_t, (is_split ? 0 : field_layout::kTvRange)>(
              PROTOBUF_TC_PARAM_PASS);
        default:
          Unreachable();
      }
    case field_layout::kRep8Bits >> field_layout::kRepShift:
      PROTOBUF_MUSTTAIL return MpPackedVarintT<is_split, bool, 0>(
          PROTOBUF_TC_PARAM_PASS);

    default:
      Unreachable();
      return nullptr;  // To silence -Werror=return-type in some toolchains
  }
}